

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::Pop
          (cmLinkedTree<cmStateDetail::PolicyStackEntry> *this,iterator it)

{
  pointer *ppPVar1;
  pointer *ppuVar2;
  pointer pPVar3;
  pointer pPVar4;
  iterator iVar5;
  PositionType PVar6;
  PositionType PVar7;
  iterator it_local;
  
  PVar6 = it.Position;
  it_local.Tree = it.Tree;
  pPVar3 = (this->Data).
           super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->Data).
           super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  it_local.Position = PVar6;
  if (pPVar3 == pPVar4) {
    __assert_fail("!this->Data.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                  ,0x92,
                  "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Pop(iterator) [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  PVar7 = (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (PVar7 == ((long)pPVar4 - (long)pPVar3) / 0x28) {
    iterator::operator++(&it_local);
    if (PVar7 == PVar6) {
      ppPVar1 = &(this->Data).
                 super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + -1;
      ppuVar2 = &(this->UpPositions).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
    }
    iVar5.Position = it_local.Position;
    iVar5.Tree = it_local.Tree;
    return iVar5;
  }
  __assert_fail("this->UpPositions.size() == this->Data.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,0x93,
                "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Pop(iterator) [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

iterator Pop(iterator it)
  {
    assert(!this->Data.empty());
    assert(this->UpPositions.size() == this->Data.size());
    bool const isLast = this->IsLast(it);
    ++it;
    // If this is the last entry then no other entry can refer
    // to it so we can drop its storage.
    if (isLast) {
      this->Data.pop_back();
      this->UpPositions.pop_back();
    }
    return it;
  }